

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall KDIS::NETWORK::Connection::SetBlockingModeEnabled(Connection *this,KBOOL E)

{
  int iVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  Connection *this_01;
  long lVar3;
  allocator<char> local_45;
  KINT32 uliIoctBlock;
  KString local_40;
  
  this->m_bBlockingSocket = E;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 2) {
      return;
    }
    uliIoctBlock = this->m_bBlockingSocket ^ 1;
    iVar1 = fcntl(this->m_iSocket[lVar3],4,0x2800,&uliIoctBlock);
    if (iVar1 == -1) break;
    lVar3 = lVar3 + 1;
  }
  this_01 = (Connection *)0x30;
  this_00 = (KException *)__cxa_allocate_exception();
  piVar2 = __errno_location();
  __s = getErrorText(this_01,*piVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_45);
  KException::KException(this_00,&local_40,0xc);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Connection::SetBlockingModeEnabled( KBOOL E )
{
    m_bBlockingSocket = E;

    for( KINT8 i = 0; i < 2; ++i )
    {
        KINT32 iResult;

#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )

        // Windows non blocking //
        unsigned long int uliIoctBlock = !m_bBlockingSocket;           // 1 enable, 0 disable.
        iResult = ioctlsocket( m_iSocket[i], FIONBIO, &uliIoctBlock ); // FIONBIO =  blocking mode

#else

        // Linux non blocking //
        KINT32 uliIoctBlock = !m_bBlockingSocket; // 1 enable, 0 disable.
        iResult = fcntl( m_iSocket[i], F_SETFL, O_NONBLOCK | FASYNC, &uliIoctBlock );

#endif

        if( iResult == SOCKET_ERROR )
        {
            THROW_ERROR;
        }
    }
}